

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O3

LPSTR CharNextExA(WORD CodePage,LPCSTR lpCurrentChar,DWORD dwFlags)

{
  BOOL BVar1;
  long lVar2;
  
  if (PAL_InitializeChakraCoreCalled) {
    if (lpCurrentChar == (LPCSTR)0x0) {
      lpCurrentChar = (LPSTR)0x0;
    }
    else if (*lpCurrentChar != '\0') {
      if (lpCurrentChar[1] == '\0') {
        lVar2 = 1;
      }
      else {
        BVar1 = IsDBCSLeadByteEx((uint)CodePage,*lpCurrentChar);
        lVar2 = 2 - (ulong)(BVar1 == 0);
      }
      lpCurrentChar = lpCurrentChar + lVar2;
    }
    if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
      return lpCurrentChar;
    }
  }
  abort();
}

Assistant:

LPSTR
PALAPI
CharNextExA(
    IN WORD CodePage,
    IN LPCSTR lpCurrentChar,
    IN DWORD dwFlags)
{
    LPSTR pRet = (LPSTR) lpCurrentChar;

    PERF_ENTRY(CharNextExA);
    ENTRY("CharNextExA (CodePage=%hu, lpCurrentChar=%p (%s), dwFlags=%#x)\n",
    CodePage, lpCurrentChar?lpCurrentChar:"NULL", lpCurrentChar?lpCurrentChar:"NULL", dwFlags);

    if ((lpCurrentChar != NULL) && (*lpCurrentChar != 0))
    {
        pRet += (*(lpCurrentChar+1) != 0) &&
            IsDBCSLeadByteEx(CodePage, *lpCurrentChar) ?  2 : 1;
    }

    LOGEXIT("CharNextExA returns LPSTR:%p (%s)\n", pRet, pRet);
    PERF_EXIT(CharNextExA);
    return pRet;
}